

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O3

void __thiscall cab::add_request(cab *this,node_type src,node_type dst,uint32_t passengers)

{
  vector<request,_std::allocator<request>_> *this_00;
  pointer *pprVar1;
  int iVar2;
  pointer prVar3;
  node_type *pnVar4;
  node_type *pnVar5;
  road_network *prVar6;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  cab_session *this_02;
  bool bVar7;
  byte bVar8;
  node_type nVar9;
  bool bVar10;
  node_type nVar11;
  bool bVar12;
  uint32_t uVar13;
  uint uVar14;
  _Atomic_word _Var15;
  pointer prVar16;
  node_type *pnVar17;
  pointer prVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  uint local_5c;
  request local_40;
  
  this_00 = &this->_requests;
  prVar3 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar16 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
            super__Vector_impl_data._M_finish;
  prVar18 = prVar16;
  if (prVar16 != prVar3) {
    lVar20 = 0;
    uVar19 = 0;
    prVar18 = prVar3;
    do {
      nVar9 = request::src((request *)(&prVar18->_src + lVar20));
      if ((nVar9 == src) &&
         (nVar9 = request::dst((request *)
                               (&((this_00->super__Vector_base<request,_std::allocator<request>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->_src + lVar20)),
         nVar9 == dst)) {
        request::add_passengers
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar20),passengers);
        return;
      }
      uVar19 = uVar19 + 1;
      prVar18 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                super__Vector_impl_data._M_start;
      prVar16 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar20 = lVar20 + 0x10;
    } while (uVar19 < (ulong)((long)prVar16 - (long)prVar18 >> 4));
  }
  pnVar4 = (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pnVar5 = (this->_route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_5c = 0;
  if (pnVar4 == pnVar5) {
    bVar21 = false;
    bVar7 = false;
  }
  else {
    bVar21 = false;
    bVar8 = 0;
    bVar7 = false;
    do {
      pnVar17 = pnVar4 + 1;
      nVar9 = *pnVar4;
      bVar21 = (bool)(nVar9 == src | bVar21);
      bVar8 = nVar9 == src | bVar8;
      bVar7 = (bool)(nVar9 == dst & bVar8 | bVar7);
      if ((bool)(bVar8 & bVar7)) break;
      pnVar4 = pnVar17;
    } while (pnVar17 != pnVar5);
  }
  if (prVar16 != prVar18) {
    lVar20 = 0;
    local_5c = 0;
    uVar19 = 0;
    do {
      bVar10 = road_network::is_inner(this->_rnet,src);
      if (!bVar21) {
        prVar6 = this->_rnet;
        nVar9 = this->_position;
        nVar11 = request::src((request *)
                              (&((this->_requests).
                                 super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_src + lVar20));
        bVar12 = road_network::in_between(prVar6,nVar9,nVar11,src);
        if (!bVar12) {
          prVar6 = this->_rnet;
          nVar9 = request::src((request *)
                               (&((this->_requests).
                                  super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                  super__Vector_impl_data._M_start)->_src + lVar20));
          nVar11 = request::dst((request *)
                                (&((this->_requests).
                                   super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_src + lVar20));
          bVar12 = road_network::in_between(prVar6,nVar9,nVar11,src);
          if (!bVar12) goto LAB_0011d2d3;
        }
        request::add_detours
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar20),2 - bVar10);
      }
LAB_0011d2d3:
      bVar10 = road_network::is_inner(this->_rnet,dst);
      if (!bVar7) {
        prVar6 = this->_rnet;
        nVar9 = this->_position;
        nVar11 = request::src((request *)
                              (&((this->_requests).
                                 super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_src + lVar20));
        bVar12 = road_network::in_between(prVar6,nVar9,nVar11,dst);
        if (!bVar12) {
          prVar6 = this->_rnet;
          nVar9 = request::src((request *)
                               (&((this->_requests).
                                  super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                  super__Vector_impl_data._M_start)->_src + lVar20));
          nVar11 = request::dst((request *)
                                (&((this->_requests).
                                   super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_src + lVar20));
          bVar12 = road_network::in_between(prVar6,nVar9,nVar11,dst);
          if (!bVar12) goto LAB_0011d366;
        }
        request::add_detours
                  ((request *)
                   (&((this_00->super__Vector_base<request,_std::allocator<request>_>)._M_impl.
                      super__Vector_impl_data._M_start)->_src + lVar20),2 - bVar10);
      }
LAB_0011d366:
      uVar13 = request::detours((request *)
                                (&((this_00->super__Vector_base<request,_std::allocator<request>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->_src + lVar20));
      if (local_5c < uVar13) {
        local_5c = request::detours((request *)
                                    (&((this_00->
                                       super__Vector_base<request,_std::allocator<request>_>).
                                       _M_impl.super__Vector_impl_data._M_start)->_src + lVar20));
      }
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x10;
    } while (uVar19 < (ulong)((long)(this->_requests).
                                    super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this->_requests).
                                    super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 4));
  }
  uVar14 = this->_costs;
  if (this->_costs < local_5c) {
    uVar14 = local_5c;
  }
  this->_costs = uVar14;
  request::request(&local_40,src,dst,passengers);
  __position._M_current =
       (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<request,_std::allocator<request>_>::_M_realloc_insert<request>
              (this_00,__position,&local_40);
  }
  else {
    (__position._M_current)->_src = local_40._src;
    (__position._M_current)->_dst = local_40._dst;
    *(undefined2 *)&(__position._M_current)->field_0x2 = local_40._2_2_;
    (__position._M_current)->_passengers = local_40._passengers;
    (__position._M_current)->_detours = local_40._detours;
    (__position._M_current)->_picked_up = local_40._picked_up;
    *(undefined3 *)&(__position._M_current)->field_0xd = local_40._13_3_;
    pprVar1 = &(this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  this_01 = (this->_cab_session).super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var15 = this_01->_M_use_count;
    do {
      if (_Var15 == 0) {
        return;
      }
      LOCK();
      iVar2 = this_01->_M_use_count;
      bVar21 = _Var15 == iVar2;
      if (bVar21) {
        this_01->_M_use_count = _Var15 + 1;
        iVar2 = _Var15;
      }
      _Var15 = iVar2;
      UNLOCK();
    } while (!bVar21);
    this_02 = (this->_cab_session).super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_01->_M_use_count != 0 && this_02 != (cab_session *)0x0) {
      cab_session::send_request
                (this_02,(this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -1);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void cab::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == src && _requests[i].dst() == dst)
        {
            _requests[i].add_passengers(passengers);
            return;
        }
    }

    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    // add detours to all requests
    // does the sme as calculate costs
    std::uint32_t max = 0;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        bool is_inner = _rnet->is_inner(src); 
        if(!found_src && (_rnet->in_between(_position, _requests[i].src(), src) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), src)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }

        is_inner = _rnet->is_inner(dst); 
        if(!found_dst && (_rnet->in_between(_position, _requests[i].src(), dst) || 
                _rnet->in_between(_requests[i].src(), _requests[i].dst(), dst)))
        {
            std::uint32_t cost = is_inner ? 1 : 2;
            _requests[i].add_detours(cost);
        }
        
        max = _requests[i].detours() > max ? _requests[i].detours() : max;
    }
    _costs = max > _costs ? max : _costs; 

    _requests.push_back(request(src, dst, passengers));

    // inform external controller
    if(auto shared = _cab_session.lock())
    {
        shared->send_request(_requests.back());
    }
}